

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool_tests.cpp
# Opt level: O1

void __thiscall pool_tests::memusage_test::test_method(memusage_test *this)

{
  ulong uVar1;
  long lVar2;
  lazy_ostream *__a;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  size_t i;
  _func_int **pp_Var5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  unsigned_long min_num_allocated_chunks;
  Map resource_map;
  unordered_map<long,_long,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_long>_>_>
  std_map;
  ResourceType resource;
  check_type cVar6;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  unsigned_long local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  lazy_ostream local_180;
  undefined1 *local_170;
  char **local_168;
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
  local_160;
  assertion_result local_150;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  _Hashtable<long,_std::pair<const_long,_long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_118;
  _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_d8;
  PoolResource<48UL,_8UL> local_a0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_d8._M_buckets = &local_d8._M_single_bucket;
  local_d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_d8._M_element_count = 0;
  local_d8._M_bucket_count = 1;
  local_d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_d8._M_rehash_policy._4_4_ = 0;
  local_d8._M_rehash_policy._M_next_resize = 0;
  local_d8._M_single_bucket = (__node_base_ptr)0x0;
  PoolResource<48UL,_8UL>::PoolResource(&local_a0,0x400);
  PoolResourceTester::CheckAllDataAccountedFor<48ul,8ul>(&local_a0);
  __a = &local_180;
  local_180._vptr_lazy_ostream = (_func_int **)&local_a0;
  std::
  _Hashtable<long,_std::pair<const_long,_long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&local_118,0,(hash<long> *)&local_150,(key_equal *)&local_160,(allocator_type *)__a);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xaf;
  file.m_begin = (iterator)&local_128;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)__a;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
  uVar1 = local_d8._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_d8._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_160.m_lhs.m_value = uVar1 + local_d8._M_element_count * 0x30;
  lVar2 = 0x30;
  if (*(long *)local_118.
               super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
               .
               super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
               ._M_tp.m_resource != 0) {
    lVar2 = (*(long *)local_118.
                      super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
                      .
                      super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
                      ._M_tp.m_resource + 0x1fU & 0xfffffffffffffff0) + 0x30;
  }
  uVar1 = local_118._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_118._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_160.m_rhs =
       (unsigned_long *)
       (uVar1 + lVar2 * *(size_t *)
                         ((long)local_118.
                                super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
                                .
                                super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
                                ._M_tp.m_resource + 0x18));
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_150,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::NE<unsigned_long,_unsigned_long,_void>_>
              *)&local_160,false);
  local_168 = &local_190;
  local_190 = "memusage::DynamicUsage(std_map) != memusage::DynamicUsage(resource_map)";
  local_188 = "";
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_198 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0xe;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_180,1,0xe,WARN,_cVar6,(size_t)&local_1a0,0xaf);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  pp_Var5 = (_func_int **)0x0;
  do {
    local_180._vptr_lazy_ostream = pp_Var5;
    std::__detail::
    _Map_base<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_d8,(key_type *)&local_180);
    local_180._vptr_lazy_ostream = pp_Var5;
    std::__detail::
    _Map_base<long,_std::pair<const_long,_long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
    ::operator[]((_Map_base<long,_std::pair<const_long,_long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&local_118,(key_type *)&local_180);
    pp_Var5 = (_func_int **)((long)pp_Var5 + 1);
  } while (pp_Var5 != (_func_int **)0x2710);
  local_1b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb7;
  file_00.m_begin = (iterator)&local_1b0;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1c0,
             msg_00);
  lVar2 = 0x30;
  if (*(size_t *)
       local_118.
       super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
       .
       super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
       ._M_tp.m_resource != 0) {
    lVar2 = (*(size_t *)
              local_118.
              super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
              .
              super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
              ._M_tp.m_resource + 0x1f & 0xfffffffffffffff0) + 0x30;
  }
  uVar1 = local_118._M_bucket_count * 8 + 0x1f & 0xfffffffffffffff0;
  if ((local_118._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_160.m_lhs.m_value =
       uVar1 + lVar2 * (((list<std::byte_*,_std::allocator<std::byte_*>_> *)
                        ((long)local_118.
                               super__Hashtable_alloc<PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>_>
                               .
                               super__Hashtable_ebo_helper<0,_PoolAllocator<std::__detail::_Hash_node<std::pair<const_long,_long>,_false>,_48UL,_8UL>,_false>
                               ._M_tp.m_resource + 8))->
                       super__List_base<std::byte_*,_std::allocator<std::byte_*>_>)._M_impl._M_node.
                       _M_size;
  uVar1 = local_d8._M_bucket_count * 8 + 0x1f & 0x7ffffffffffffff0;
  if ((local_d8._M_bucket_count & 0x1fffffffffffffff) == 0) {
    uVar1 = 0;
  }
  local_160.m_rhs = (unsigned_long *)(((uVar1 + local_d8._M_element_count * 0x30) * 0x5a) / 100);
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_150,
             (binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long,_boost::test_tools::assertion::op::LE<unsigned_long,_unsigned_long,_void>_>
              *)&local_160,false);
  local_190 = "memusage::DynamicUsage(resource_map) <= memusage::DynamicUsage(std_map) * 90 / 100";
  local_188 = "";
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1c8 = "";
  pvVar3 = (iterator)0x1;
  pvVar4 = (iterator)0xe;
  local_168 = &local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_180,1,0xe,WARN,_cVar6,(size_t)&local_1d0,0xb7);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  local_1d8 = local_118._M_element_count / (local_a0.m_chunk_size_bytes >> 4) + 1;
  local_1e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_1e0 = "";
  local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xbc;
  file_01.m_begin = (iterator)&local_1e8;
  msg_01.m_end = pvVar4;
  msg_01.m_begin = pvVar3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1f8,
             msg_01);
  local_160.m_lhs.m_value =
       local_a0.m_allocated_chunks.super__List_base<std::byte_*,_std::allocator<std::byte_*>_>.
       _M_impl._M_node._M_size;
  local_160.m_rhs = &local_1d8;
  boost::test_tools::assertion::
  binary_expr<boost::test_tools::assertion::value_expr<unsigned_long>,_unsigned_long_&,_boost::test_tools::assertion::op::GE<unsigned_long,_unsigned_long,_void>_>
  ::evaluate(&local_150,&local_160,false);
  local_190 = "resource.NumAllocatedChunks() >= min_num_allocated_chunks";
  local_188 = "";
  local_180.m_empty = false;
  local_180._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_170 = boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/pool_tests.cpp"
  ;
  local_200 = "";
  local_168 = &local_190;
  boost::test_tools::tt_detail::report_assertion
            (&local_150,&local_180,1,0xe,WARN,_cVar6,(size_t)&local_208,0xbc);
  boost::detail::shared_count::~shared_count(&local_150.m_message.pn);
  std::
  _Hashtable<long,_std::pair<const_long,_long>,_PoolAllocator<std::pair<const_long,_long>,_48UL,_8UL>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_118);
  PoolResourceTester::CheckAllDataAccountedFor<48ul,8ul>(&local_a0);
  PoolResource<48UL,_8UL>::~PoolResource(&local_a0);
  std::
  _Hashtable<long,_std::pair<const_long,_long>,_std::allocator<std::pair<const_long,_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(memusage_test)
{
    auto std_map = std::unordered_map<int64_t, int64_t>{};

    using Map = std::unordered_map<int64_t,
                                   int64_t,
                                   std::hash<int64_t>,
                                   std::equal_to<int64_t>,
                                   PoolAllocator<std::pair<const int64_t, int64_t>,
                                                 sizeof(std::pair<const int64_t, int64_t>) + sizeof(void*) * 4>>;
    auto resource = Map::allocator_type::ResourceType(1024);

    PoolResourceTester::CheckAllDataAccountedFor(resource);

    {
        auto resource_map = Map{0, std::hash<int64_t>{}, std::equal_to<int64_t>{}, &resource};

        // can't have the same resource usage
        BOOST_TEST(memusage::DynamicUsage(std_map) != memusage::DynamicUsage(resource_map));

        for (size_t i = 0; i < 10000; ++i) {
            std_map[i];
            resource_map[i];
        }

        // Eventually the resource_map should have a much lower memory usage because it has less malloc overhead
        BOOST_TEST(memusage::DynamicUsage(resource_map) <= memusage::DynamicUsage(std_map) * 90 / 100);

        // Make sure the pool is actually used by the nodes
        auto max_nodes_per_chunk = resource.ChunkSizeBytes() / sizeof(Map::value_type);
        auto min_num_allocated_chunks = resource_map.size() / max_nodes_per_chunk + 1;
        BOOST_TEST(resource.NumAllocatedChunks() >= min_num_allocated_chunks);
    }

    PoolResourceTester::CheckAllDataAccountedFor(resource);
}